

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TupleValue::SerializeWithCachedSizes
          (TupleValue *this,CodedOutputStream *output)

{
  uint uVar1;
  Value *value;
  undefined4 local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  TupleValue *this_local;
  
  local_20 = 0;
  uVar1 = values_size(this);
  for (; local_20 < uVar1; local_20 = local_20 + 1) {
    value = values(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void TupleValue::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.TupleValue)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.MILSpec.Value values = 1;
  for (unsigned int i = 0, n = this->values_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->values(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.TupleValue)
}